

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcess.cpp
# Opt level: O1

void __thiscall MultiAgentDecisionProcess::AddAgent(MultiAgentDecisionProcess *this,string *name)

{
  size_t sVar1;
  iterator __position;
  uint uVar2;
  string local_a0;
  Agent local_80;
  
  sVar1 = this->_m_nrAgents;
  this->_m_nrAgents = sVar1 + 1;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"undefined","");
  NamedDescribedEntity::NamedDescribedEntity(&local_80.super_NamedDescribedEntity,name,&local_a0);
  uVar2 = (uint)sVar1;
  local_80.super_NamedDescribedEntity._vptr_NamedDescribedEntity =
       (_func_int **)&PTR__Agent_005d03a8;
  local_80.super_DiscreteEntity._vptr_DiscreteEntity = (_func_int **)&PTR__Agent_005d03d8;
  local_80.super_DiscreteEntity._m_index = uVar2;
  std::vector<Agent,_std::allocator<Agent>_>::emplace_back<Agent>(&this->_m_agents,&local_80);
  NamedDescribedEntity::~NamedDescribedEntity(&local_80.super_NamedDescribedEntity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_80.super_NamedDescribedEntity._vptr_NamedDescribedEntity =
       (_func_int **)
       CONCAT44(local_80.super_NamedDescribedEntity._vptr_NamedDescribedEntity._4_4_,uVar2);
  __position._M_current =
       (this->_m_allAgentsScope).super_SDT.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_m_allAgentsScope).super_SDT.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->_m_allAgentsScope,
               __position,(uint *)&local_80);
  }
  else {
    *__position._M_current = uVar2;
    (this->_m_allAgentsScope).super_SDT.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void MultiAgentDecisionProcess::AddAgent(string name)
{
    Index agI = _m_nrAgents++;
    _m_agents.push_back( Agent(agI, name) );
    _m_allAgentsScope.Insert(agI);
}